

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86.cpp
# Opt level: O0

int __thiscall
ncnn::ConvolutionDepthWise_x86::load_model(ConvolutionDepthWise_x86 *this,ModelBin *mb)

{
  ulong uVar1;
  int iVar2;
  size_type sVar3;
  reference ppLVar4;
  long in_RDI;
  Mat weights [4];
  ParamDict pd;
  Layer *op;
  Mat bias_data_g;
  Mat weight_data_g;
  int g;
  int num_output_g;
  int channels_g;
  int i;
  int channels;
  int maxk;
  int ret;
  ModelBin *in_stack_00000be0;
  ConvolutionDepthWise *in_stack_00000be8;
  undefined4 in_stack_fffffffffffff808;
  int in_stack_fffffffffffff80c;
  int in_stack_fffffffffffff810;
  int in_stack_fffffffffffff814;
  Mat *in_stack_fffffffffffff818;
  size_type in_stack_fffffffffffff828;
  Layer *pLVar5;
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *in_stack_fffffffffffff830;
  ParamDict *pPVar6;
  ParamDict *local_7c8;
  ParamDict *in_stack_fffffffffffff860;
  ParamDict *local_790;
  undefined1 local_768 [128];
  undefined1 local_6e8 [1520];
  Layer *local_f8;
  Mat local_a8 [2];
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  undefined4 local_1c;
  int local_4;
  
  local_4 = ConvolutionDepthWise::load_model(in_stack_00000be8,in_stack_00000be0);
  if (local_4 == 0) {
    local_20 = *(int *)(in_RDI + 0x84) * *(int *)(in_RDI + 0x88);
    uVar1 = (long)*(int *)(in_RDI + 0xa8) / (long)*(int *)(in_RDI + 0xac);
    local_24 = ((int)((long)((ulong)(uint)((int)uVar1 >> 0x1f) << 0x20 | uVar1 & 0xffffffff) /
                     (long)local_20) / (*(int *)(in_RDI + 0x80) / *(int *)(in_RDI + 0xac))) *
               *(int *)(in_RDI + 0xac);
    local_1c = 0;
    for (local_28 = 0; iVar2 = local_28,
        sVar3 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::size
                          ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 0x1d0)
                          ), iVar2 < (int)sVar3; local_28 = local_28 + 1) {
      ppLVar4 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                          ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 0x1d0)
                           ,(long)local_28);
      if (*ppLVar4 != (value_type)0x0) {
        (*(*ppLVar4)->_vptr_Layer[1])();
      }
    }
    std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::clear
              ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)0x143d30);
    if (((((local_24 == *(int *)(in_RDI + 0xac)) &&
          (*(int *)(in_RDI + 0xac) == *(int *)(in_RDI + 0x80))) && (*(int *)(in_RDI + 0x84) == 3))
        && ((*(int *)(in_RDI + 0x88) == 3 && (*(int *)(in_RDI + 0x8c) == 1)))) &&
       ((*(int *)(in_RDI + 0x90) == 1 &&
        (((*(int *)(in_RDI + 0x94) == 1 && (*(int *)(in_RDI + 0x98) == 1)) ||
         ((*(int *)(in_RDI + 0x94) == 2 && (*(int *)(in_RDI + 0x98) == 2)))))))) {
      local_4 = 0;
    }
    else {
      local_2c = local_24 / *(int *)(in_RDI + 0xac);
      local_30 = *(int *)(in_RDI + 0x80) / *(int *)(in_RDI + 0xac);
      std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::resize
                (in_stack_fffffffffffff830,in_stack_fffffffffffff828);
      for (local_34 = 0; local_34 < *(int *)(in_RDI + 0xac); local_34 = local_34 + 1) {
        Mat::range(in_stack_fffffffffffff818,in_stack_fffffffffffff814,in_stack_fffffffffffff810);
        Mat::Mat(local_a8);
        if (*(int *)(in_RDI + 0xa4) != 0) {
          Mat::range(in_stack_fffffffffffff818,in_stack_fffffffffffff814,in_stack_fffffffffffff810);
          Mat::operator=(in_stack_fffffffffffff818,
                         (Mat *)CONCAT44(in_stack_fffffffffffff814,in_stack_fffffffffffff810));
          Mat::~Mat((Mat *)0x143f38);
        }
        local_f8 = create_layer(in_stack_fffffffffffff80c);
        ParamDict::ParamDict(in_stack_fffffffffffff860);
        ParamDict::set((ParamDict *)(local_6e8 + 0xe0),0,local_30);
        ParamDict::set((ParamDict *)(local_6e8 + 0xe0),1,*(int *)(in_RDI + 0x84));
        ParamDict::set((ParamDict *)(local_6e8 + 0xe0),0xb,*(int *)(in_RDI + 0x88));
        ParamDict::set((ParamDict *)(local_6e8 + 0xe0),2,*(int *)(in_RDI + 0x8c));
        ParamDict::set((ParamDict *)(local_6e8 + 0xe0),0xc,*(int *)(in_RDI + 0x90));
        ParamDict::set((ParamDict *)(local_6e8 + 0xe0),3,*(int *)(in_RDI + 0x94));
        ParamDict::set((ParamDict *)(local_6e8 + 0xe0),0xd,*(int *)(in_RDI + 0x98));
        ParamDict::set((ParamDict *)(local_6e8 + 0xe0),4,0);
        ParamDict::set((ParamDict *)(local_6e8 + 0xe0),0xe,0);
        ParamDict::set((ParamDict *)(local_6e8 + 0xe0),5,*(int *)(in_RDI + 0xa4));
        ParamDict::set((ParamDict *)(local_6e8 + 0xe0),6,local_20 * local_2c * local_30);
        ParamDict::set((ParamDict *)(local_6e8 + 0xe0),8,*(int *)(in_RDI + 0xb0));
        (*local_f8->_vptr_Layer[2])(local_f8,local_6e8 + 0xe0);
        in_stack_fffffffffffff860 = (ParamDict *)local_6e8;
        local_790 = in_stack_fffffffffffff860;
        do {
          Mat::Mat((Mat *)local_790);
          local_790 = (ParamDict *)&local_790->params[0].v.dims;
        } while (local_790 != (ParamDict *)(local_6e8 + 0xe0));
        Mat::operator=(in_stack_fffffffffffff818,
                       (Mat *)CONCAT44(in_stack_fffffffffffff814,in_stack_fffffffffffff810));
        Mat::operator=(in_stack_fffffffffffff818,
                       (Mat *)CONCAT44(in_stack_fffffffffffff814,in_stack_fffffffffffff810));
        if (*(int *)(in_RDI + 0xb0) != 0) {
          Mat::range(in_stack_fffffffffffff818,in_stack_fffffffffffff814,in_stack_fffffffffffff810);
          Mat::operator=(in_stack_fffffffffffff818,
                         (Mat *)CONCAT44(in_stack_fffffffffffff814,in_stack_fffffffffffff810));
          Mat::~Mat((Mat *)0x144238);
          Mat::range(in_stack_fffffffffffff818,in_stack_fffffffffffff814,in_stack_fffffffffffff810);
          Mat::operator=(in_stack_fffffffffffff818,
                         (Mat *)CONCAT44(in_stack_fffffffffffff814,in_stack_fffffffffffff810));
          Mat::~Mat((Mat *)0x144286);
        }
        pLVar5 = local_f8;
        ModelBinFromMatArray::ModelBinFromMatArray
                  ((ModelBinFromMatArray *)
                   CONCAT44(in_stack_fffffffffffff814,in_stack_fffffffffffff810),
                   (Mat *)CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808));
        (*pLVar5->_vptr_Layer[3])(pLVar5,local_768);
        pLVar5 = local_f8;
        ppLVar4 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                            ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                             (in_RDI + 0x1d0),(long)local_34);
        *ppLVar4 = pLVar5;
        pPVar6 = (ParamDict *)local_6e8;
        local_7c8 = (ParamDict *)(local_6e8 + 0xe0);
        do {
          local_7c8 = (ParamDict *)&local_7c8[-1].params[0x13].v;
          Mat::~Mat((Mat *)0x1443f3);
        } while (local_7c8 != pPVar6);
        ParamDict::~ParamDict(local_7c8);
        Mat::~Mat((Mat *)0x144421);
        Mat::~Mat((Mat *)0x14442e);
      }
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int ConvolutionDepthWise_x86::load_model(const ModelBin& mb)
{
    int ret = ConvolutionDepthWise::load_model(mb);
    if (ret != 0)
        return ret;

    // create Convolution op for each group
    const int maxk = kernel_w * kernel_h;
    int channels = (weight_data_size / group) / maxk / (num_output / group) * group;

    for (int i=0; i<(int)group_ops.size(); i++)
        delete group_ops[i];

    group_ops.clear();

    if (channels == group && group == num_output)
    {
        // depth-wise specific
        if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1)
        {
            if ((stride_w == 1 && stride_h == 1) || (stride_w == 2 && stride_h == 2))
            {
                return 0;
            }
        }
    }

    const int channels_g = channels / group;
    const int num_output_g = num_output / group;

    group_ops.resize(group);

    for (int g=0; g<group; g++)
    {
        Mat weight_data_g = weight_data.range(maxk * channels_g * num_output_g * g, maxk * channels_g * num_output_g);
        Mat bias_data_g;
        if (bias_term)
            bias_data_g = bias_data.range(num_output_g * g, num_output_g);

        ncnn::Layer* op = ncnn::create_layer(ncnn::LayerType::Convolution);

        // set param
        ncnn::ParamDict pd;
        pd.set(0, num_output_g);// num_output
        pd.set(1, kernel_w);
        pd.set(11, kernel_h);
        pd.set(2, dilation_w);
        pd.set(12, dilation_h);
        pd.set(3, stride_w);
        pd.set(13, stride_h);
        pd.set(4, 0);// pad_w
        pd.set(14, 0);// pad_h
        pd.set(5, bias_term);
        pd.set(6, maxk * channels_g * num_output_g);// weight_data_size
        pd.set(8, int8_scale_term);

        op->load_param(pd);

        // set weights
        ncnn::Mat weights[4];
        weights[0] = weight_data_g;
        weights[1] = bias_data_g;

        if (int8_scale_term)
        {
            weights[2] = weight_data_int8_scales.range(g, 1);
            weights[3] = bottom_blob_int8_scales.range(g, 1);
        }

        op->load_model(ModelBinFromMatArray(weights));

        group_ops[g] = op;
    }

    return 0;
}